

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
LeavesAtDifferentLevels_ForwardIteration_Test::TestBody
          (LeavesAtDifferentLevels_ForwardIteration_Test *this)

{
  database *db;
  test_trie *ptVar1;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phVar2;
  uint generation;
  value_reference_type ppVar3;
  value_reference_type ppVar4;
  iterator_base<false> *piVar5;
  index_pointer node;
  char *pcVar6;
  AssertHelper local_8a0;
  AssertionResult gtest_ar_10;
  string v5;
  AssertHelper local_868;
  string v8;
  string v7;
  string v6;
  const_iterator cbegin;
  transaction_type t1;
  iterator begin;
  const_iterator cend;
  iterator end;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_408;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_310;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_218;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_120;
  
  db = &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.db_;
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&begin,
             (mutex_type *)
             &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,db,(lock_type *)&begin);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&begin);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&begin,"a",(allocator *)&end);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_120,ptVar1,&t1,(string *)&begin);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_120.first.pos_);
  std::__cxx11::string::~string((string *)&begin);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&begin,"b",(allocator *)&end);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_218,ptVar1,&t1,(string *)&begin);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_218.first.pos_);
  std::__cxx11::string::~string((string *)&begin);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&begin,"c",(allocator *)&end);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_310,ptVar1,&t1,(string *)&begin);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_310.first.pos_);
  std::__cxx11::string::~string((string *)&begin);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&begin,"d",(allocator *)&end);
  piVar5 = &begin;
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_408,ptVar1,&t1,(string *)piVar5);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_408.first.pos_);
  std::__cxx11::string::~string((string *)&begin);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(&begin,(this->super_LeavesAtDifferentLevels).index_._M_t.
                 super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                 ._M_head_impl,db);
  phVar2 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  memset(&end.visited_parents_,0,0xd8);
  end.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  end.db_ = db;
  end.index_ = phVar2;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            ((char *)&cbegin,(char *)&begin,&end,piVar5);
  if ((char)cbegin.db_ == '\0') {
    testing::Message::Message((Message *)&cend);
    if (cbegin.visited_parents_.c_._M_elems[0].node.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((cbegin.visited_parents_.c_._M_elems[0].node.internal_)->signature_).
                         _M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x61d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v5,(Message *)&cend);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v5);
    if (cend.db_ != (database_reference)0x0) {
      (*(cend.db_)->_vptr_database[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cbegin.visited_parents_);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&cbegin,"\"a\"","v1",(char (*) [2])0x1edea1,&ppVar3->first);
  if ((char)cbegin.db_ == '\0') {
    testing::Message::Message((Message *)&cend);
    if (cbegin.visited_parents_.c_._M_elems[0].node.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((cbegin.visited_parents_.c_._M_elems[0].node.internal_)->signature_).
                         _M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x620,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v5,(Message *)&cend);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v5);
    if (cend.db_ != (database_reference)0x0) {
      (*(cend.db_)->_vptr_database[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cbegin.visited_parents_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&cbegin,"\"b\"","v2",(char (*) [2])0x1e8fd5,&ppVar3->first);
  if ((char)cbegin.db_ == '\0') {
    testing::Message::Message((Message *)&cend);
    if (cbegin.visited_parents_.c_._M_elems[0].node.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((cbegin.visited_parents_.c_._M_elems[0].node.internal_)->signature_).
                         _M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x623,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v5,(Message *)&cend);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v5);
    if (cend.db_ != (database_reference)0x0) {
      (*(cend.db_)->_vptr_database[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cbegin.visited_parents_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&cbegin,"\"c\"","v3",(char (*) [2])0x1ef03e,&ppVar3->first);
  if ((char)cbegin.db_ == '\0') {
    testing::Message::Message((Message *)&cend);
    if (cbegin.visited_parents_.c_._M_elems[0].node.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((cbegin.visited_parents_.c_._M_elems[0].node.internal_)->signature_).
                         _M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x626,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v5,(Message *)&cend);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v5);
    if (cend.db_ != (database_reference)0x0) {
      (*(cend.db_)->_vptr_database[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cbegin.visited_parents_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  piVar5 = (iterator_base<false> *)0x1e4284;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&cbegin,"\"d\"","v4",(char (*) [2])0x1e4284,&ppVar3->first);
  if ((char)cbegin.db_ == '\0') {
    testing::Message::Message((Message *)&cend);
    if (cbegin.visited_parents_.c_._M_elems[0].node.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((cbegin.visited_parents_.c_._M_elems[0].node.internal_)->signature_).
                         _M_elems;
    }
    piVar5 = (iterator_base<false> *)0x629;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x629,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v5,(Message *)&cend);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v5);
    if (cend.db_ != (database_reference)0x0) {
      (*(cend.db_)->_vptr_database[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cbegin.visited_parents_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            ((char *)&cbegin,(char *)&begin,&end,piVar5);
  if ((char)cbegin.db_ == '\0') {
    testing::Message::Message((Message *)&cend);
    if (cbegin.visited_parents_.c_._M_elems[0].node.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((cbegin.visited_parents_.c_._M_elems[0].node.internal_)->signature_).
                         _M_elems;
    }
    piVar5 = (iterator_base<false> *)0x62b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x62b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v5,(Message *)&cend);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v5);
    if (cend.db_ != (database_reference)0x0) {
      (*(cend.db_)->_vptr_database[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cbegin.visited_parents_);
  phVar2 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  node.internal_ = (internal_node *)&t1;
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(phVar2,(transaction_base *)node.internal_,generation);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)
             (((this->super_LeavesAtDifferentLevels).index_._M_t.
               super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
              ._M_head_impl)->root_).internal_,node);
  pstore::index::
  hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
  ::
  make_begin_iterator<pstore::database_const&,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>const&,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<true>>
            (&cbegin,(hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                      *)db,
             (database *)
             (this->super_LeavesAtDifferentLevels).index_._M_t.
             super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
             ._M_head_impl,
             (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)piVar5);
  phVar2 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  memset(&cend.visited_parents_,0,0xd8);
  cend.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  cend.db_ = db;
  cend.index_ = phVar2;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<true>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<true>>
            ((internal *)&v5,"cbegin","cend",&cbegin,&cend);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)v5._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x633,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  ppVar4 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<true>::operator*(&cbegin);
  std::__cxx11::string::string((string *)&v5,(string *)ppVar4);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v6,"\"a\"","v5",(char (*) [2])0x1edea1,&v5);
  if ((char)v6._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v7);
    if (v6._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)v6._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x636,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v8,(Message *)&v7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v8);
    if ((long *)CONCAT71(v7._M_dataplus._M_p._1_7_,(char)v7._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v7._M_dataplus._M_p._1_7_,(char)v7._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v6._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<true>::operator++(&cbegin);
  ppVar4 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<true>::operator*(&cbegin);
  std::__cxx11::string::string((string *)&v6,(string *)ppVar4);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v7,"\"b\"","v6",(char (*) [2])0x1e8fd5,&v6);
  if ((char)v7._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v8);
    if (v7._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)v7._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x639,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&v8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    if ((long *)CONCAT71(v8._M_dataplus._M_p._1_7_,(char)v8._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v8._M_dataplus._M_p._1_7_,(char)v8._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v7._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<true>::operator++(&cbegin);
  ppVar4 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<true>::operator*(&cbegin);
  std::__cxx11::string::string((string *)&v7,(string *)ppVar4);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v8,"\"c\"","v7",(char (*) [2])0x1ef03e,&v7);
  if ((char)v8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_10);
    if (v8._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)v8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x63c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_8a0,(Message *)&gtest_ar_10);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    if ((long *)CONCAT71(gtest_ar_10._1_7_,gtest_ar_10.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_10._1_7_,gtest_ar_10.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v8._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<true>::operator++(&cbegin);
  ppVar4 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<true>::operator*(&cbegin);
  std::__cxx11::string::string((string *)&v8,(string *)ppVar4);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar_10,"\"d\"","v8",(char (*) [2])0x1e4284,&v8);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&local_8a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_10.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x63f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_868,(Message *)&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    if (local_8a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_8a0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_10.message_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<true>::operator++(&cbegin);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<true>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<true>,_nullptr>
            ((EqHelper *)&gtest_ar_10,"cbegin","cend",&cbegin,&cend);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&local_8a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_10.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x641,pcVar6);
    testing::internal::AssertHelper::operator=(&local_868,(Message *)&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    if (local_8a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_8a0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_10.message_);
  std::__cxx11::string::~string((string *)&v8);
  std::__cxx11::string::~string((string *)&v7);
  std::__cxx11::string::~string((string *)&v6);
  std::__cxx11::string::~string((string *)&v5);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&cend.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&cbegin.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&end.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&begin.pos_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  return;
}

Assistant:

TEST_F (LeavesAtDifferentLevels, ForwardIteration) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    // With a known hash function and the insertion order below, we should end up with a
    // trie which looks like:
    //
    //          +--------+--------+--------+
    // root_ -> | 000000 | 000001 | 000010 |   (hash bits 0-5)
    //          +--------+--------+--------+
    //              |        |        |
    //              v        |        |
    //             "a"       |        v       (0b000000'000000)
    //                       |       "d"      (0b000000'000010)
    //                       v
    //              +--------+--------+
    //              | 000000 | 000001 |       (hash bits 6-11)
    //              +--------+--------+
    //                  |        |
    //                  v        |
    //                 "b"       v            (0b000000'000001)
    //                          "c"           (0b000001'000001)
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    this->insert_or_assign (*index_, t1, "d");

    test_trie::iterator begin = index_->begin (db_);
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("a", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("b", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    std::string const & v4 = (*begin).first;
    EXPECT_EQ ("d", v4);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());
    this->check_is_store_internal_node (index_->root ());

    // Check trie iterator in the store.
    test_trie::const_iterator cbegin = index_->cbegin (db_);
    test_trie::const_iterator cend = index_->cend (db_);
    EXPECT_NE (cbegin, cend);

    std::string const v5 = cbegin->first;
    EXPECT_EQ ("a", v5);
    ++cbegin;
    std::string const v6 = cbegin->first;
    EXPECT_EQ ("b", v6);
    ++cbegin;
    std::string const v7 = cbegin->first;
    EXPECT_EQ ("c", v7);
    ++cbegin;
    std::string const v8 = cbegin->first;
    EXPECT_EQ ("d", v8);
    ++cbegin;
    EXPECT_EQ (cbegin, cend);
}